

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

int redisGetReply(redisContext *c,void **reply)

{
  int iVar1;
  int iVar2;
  int wdone;
  void *aux;
  
  wdone = 0;
  aux = (void *)0x0;
  iVar1 = redisGetReplyFromReader(c,&aux);
  iVar2 = -1;
  if (iVar1 != -1) {
    if (aux == (void *)0x0) {
      if ((c->flags & 1) == 0) {
        aux = (void *)0x0;
      }
      else {
        do {
          iVar2 = redisBufferWrite(c,&wdone);
          if (iVar2 == -1) {
            return -1;
          }
        } while (wdone == 0);
        do {
          iVar2 = redisBufferRead(c);
          if (iVar2 == -1) {
            return -1;
          }
          iVar2 = redisGetReplyFromReader(c,&aux);
          if (iVar2 == -1) {
            return -1;
          }
        } while (aux == (void *)0x0);
      }
    }
    iVar2 = 0;
    if (reply != (void **)0x0) {
      *reply = aux;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int redisGetReply(redisContext *c, void **reply) {
    int wdone = 0;
    void *aux = NULL;

    /* Try to read pending replies */
    if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
        return REDIS_ERR;

    /* For the blocking context, flush output buffer and read reply */
    if (aux == NULL && c->flags & REDIS_BLOCK) {
        /* Write until done */
        do {
            if (redisBufferWrite(c,&wdone) == REDIS_ERR)
                return REDIS_ERR;
        } while (!wdone);

        /* Read until there is a reply */
        do {
            if (redisBufferRead(c) == REDIS_ERR)
                return REDIS_ERR;
            if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
                return REDIS_ERR;
        } while (aux == NULL);
    }

    /* Set reply object */
    if (reply != NULL) *reply = aux;
    return REDIS_OK;
}